

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

int Mio_CollectRootsNewDefault3(int nInputs,Vec_Ptr_t **pvNames,Vec_Wrd_t **pvTruths)

{
  uint uVar1;
  undefined8 *puVar2;
  void *pvVar3;
  word wVar4;
  word *pwVar5;
  word wVar6;
  word wVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Mio_Library_t *pLib;
  void *__ptr;
  Mio_Gate_t *pGate;
  Vec_Ptr_t *pVVar11;
  void **ppvVar12;
  Vec_Wrd_t *pVVar13;
  word *pwVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  if (pLib == (Mio_Library_t *)0x0) {
    return 0;
  }
  uVar8 = Mio_LibraryReadGateNum(pLib);
  __ptr = calloc((long)(int)uVar8,8);
  for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
      pGate = Mio_GateReadNext(pGate)) {
    *(Mio_Gate_t **)((long)__ptr + (long)pGate->Cell * 8) = pGate;
  }
  pVVar11 = (Vec_Ptr_t *)malloc(0x10);
  uVar16 = 8;
  if (6 < uVar8 - 1) {
    uVar16 = uVar8;
  }
  pVVar11->nSize = 0;
  pVVar11->nCap = uVar16;
  if (uVar16 == 0) {
    ppvVar12 = (void **)0x0;
  }
  else {
    ppvVar12 = (void **)malloc((long)(int)uVar16 << 3);
  }
  pVVar11->pArray = ppvVar12;
  *pvNames = pVVar11;
  iVar15 = uVar8 * 4;
  pVVar13 = (Vec_Wrd_t *)malloc(0x10);
  iVar9 = 0x10;
  if (0xe < uVar8 * 4 - 1) {
    iVar9 = iVar15;
  }
  pVVar13->nSize = 0;
  pVVar13->nCap = iVar9;
  if (iVar9 == 0) {
    pwVar14 = (word *)0x0;
  }
  else {
    pwVar14 = (word *)malloc((long)iVar9 << 3);
  }
  pVVar13->pArray = pwVar14;
  pVVar13->nSize = iVar15;
  memset(pwVar14,0,(long)iVar15 << 3);
  *pvTruths = pVVar13;
  uVar16 = 0;
  if (0 < (int)uVar8) {
    uVar17 = 0;
    uVar16 = 0;
    do {
      puVar2 = *(undefined8 **)((long)__ptr + uVar17 * 8);
      if ((*(int *)((long)puVar2 + 0x44) <= nInputs) && (puVar2[7] == 0)) {
        pVVar11 = *pvNames;
        pvVar3 = (void *)*puVar2;
        uVar1 = pVVar11->nCap;
        if (pVVar11->nSize == uVar1) {
          if ((int)uVar1 < 0x10) {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar12 = (void **)malloc(0x80);
            }
            else {
              ppvVar12 = (void **)realloc(pVVar11->pArray,0x80);
            }
            pVVar11->pArray = ppvVar12;
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar1 * 2;
            if (iVar9 <= (int)uVar1) goto LAB_003decb7;
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar12 = (void **)malloc((ulong)uVar1 << 4);
            }
            else {
              ppvVar12 = (void **)realloc(pVVar11->pArray,(ulong)uVar1 << 4);
            }
            pVVar11->pArray = ppvVar12;
          }
          pVVar11->nCap = iVar9;
        }
LAB_003decb7:
        iVar9 = pVVar11->nSize;
        pVVar11->nSize = iVar9 + 1;
        pVVar11->pArray[iVar9] = pvVar3;
        if ((int)uVar16 < 0) {
LAB_003dede6:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
        }
        uVar10 = uVar16 * 4;
        uVar1 = (*pvTruths)->nSize;
        if (uVar1 == uVar10 || SBORROW4(uVar1,uVar10) != (int)(uVar1 + uVar16 * -4) < 0)
        goto LAB_003dede6;
        uVar16 = uVar16 + 1;
        pwVar14 = (*pvTruths)->pArray + uVar10;
        iVar9 = *(int *)((long)puVar2 + 0x44);
        if (iVar9 < 7) {
          wVar4 = puVar2[0xd];
          pwVar14[3] = wVar4;
          pwVar14[2] = wVar4;
          pwVar14[1] = wVar4;
          *pwVar14 = wVar4;
        }
        else if (iVar9 == 8) {
          pwVar5 = (word *)puVar2[0xd];
          wVar4 = *pwVar5;
          wVar6 = pwVar5[1];
          wVar7 = pwVar5[3];
          pwVar14[2] = pwVar5[2];
          pwVar14[3] = wVar7;
          *pwVar14 = wVar4;
          pwVar14[1] = wVar6;
        }
        else if (iVar9 == 7) {
          wVar4 = *(word *)puVar2[0xd];
          pwVar14[2] = wVar4;
          *pwVar14 = wVar4;
          wVar4 = *(word *)(puVar2[0xd] + 8);
          pwVar14[3] = wVar4;
          pwVar14[1] = wVar4;
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar8 != uVar17);
  }
  if (uVar16 != uVar8) {
    __assert_fail("iGate == nGates",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                  ,0x337,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
  }
  iVar9 = (*pvTruths)->nSize;
  if (0 < iVar9) {
    pwVar14 = (*pvTruths)->pArray;
    if (*pwVar14 != 0) {
      __assert_fail("Vec_WrdEntry(*pvTruths, 0) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x338,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
    }
    if (4 < iVar9) {
      if (pwVar14[4] != 0xffffffffffffffff) {
        __assert_fail("Vec_WrdEntry(*pvTruths, 4) == ~(word)0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                      ,0x339,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
      }
      if (8 < iVar9) {
        if (pwVar14[8] != 0xaaaaaaaaaaaaaaaa) {
          __assert_fail("Vec_WrdEntry(*pvTruths, 8) == s_Truths6[0]",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                        ,0x33a,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)");
        }
        if (0xc < iVar9) {
          if (pwVar14[0xc] != 0x5555555555555555) {
            __assert_fail("Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                          ,0x33b,"int Mio_CollectRootsNewDefault3(int, Vec_Ptr_t **, Vec_Wrd_t **)")
            ;
          }
          if (__ptr == (void *)0x0) {
            return uVar8;
          }
          free(__ptr);
          return uVar8;
        }
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
}

Assistant:

int Mio_CollectRootsNewDefault3( int nInputs, Vec_Ptr_t ** pvNames, Vec_Wrd_t ** pvTruths )
{
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    int i, iGate = 0, nGates = pLib ? Mio_LibraryReadGateNum( pLib ) : 0;
    Mio_Gate_t * pGate0, ** ppGates; word * pTruth;
    if ( pLib == NULL )
        return 0;
    ppGates = ABC_CALLOC( Mio_Gate_t *, nGates );
    Mio_LibraryForEachGate( pLib, pGate0 )
        ppGates[pGate0->Cell] = pGate0;
    *pvNames  = Vec_PtrAlloc( nGates );
    *pvTruths = Vec_WrdStart( nGates * 4 );
    for ( i = 0; i < nGates; i++ )
    {
        pGate0 = ppGates[i];
        if ( pGate0->nInputs > nInputs || pGate0->pTwin ) // skip large and multi-output
            continue;
        Vec_PtrPush( *pvNames, pGate0->pName );
        pTruth = Vec_WrdEntryP( *pvTruths, iGate++*4 );
        if ( pGate0->nInputs <= 6 )
            pTruth[0] = pTruth[1] = pTruth[2] = pTruth[3] = pGate0->uTruth;
        else if ( pGate0->nInputs == 7 )
        {
            pTruth[0] = pTruth[2] = pGate0->pTruth[0];
            pTruth[1] = pTruth[3] = pGate0->pTruth[1];
        }
        else if ( pGate0->nInputs == 8 )
            memcpy( pTruth, pGate0->pTruth, (size_t)(4*sizeof(word)) );
    }
    assert( iGate == nGates );
    assert( Vec_WrdEntry(*pvTruths,  0) ==        0 );
    assert( Vec_WrdEntry(*pvTruths,  4) == ~(word)0 );
    assert( Vec_WrdEntry(*pvTruths,  8) ==  s_Truths6[0] );
    assert( Vec_WrdEntry(*pvTruths, 12) == ~s_Truths6[0] );
    ABC_FREE( ppGates );
    return nGates;
}